

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

bool __thiscall
density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
consume_operation::start_consume_impl
          (consume_operation *this,PrivateType param_1,
          heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *i_queue)

{
  ControlBlock *pCVar1;
  
  if (*(ControlBlock **)(this + 8) != (ControlBlock *)0x0) {
    heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
    cancel_consume_impl(*(heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>
                          **)this,*(ControlBlock **)(this + 8));
  }
  *(heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> **)
   this = i_queue;
  pCVar1 = heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
           start_consume_impl(i_queue);
  *(ControlBlock **)(this + 8) = pCVar1;
  return pCVar1 != (ControlBlock *)0x0;
}

Assistant:

bool start_consume_impl(PrivateType, heter_queue * i_queue)
            {
                if (m_control != nullptr)
                {
                    m_queue->cancel_consume_impl(m_control);
                }
                m_queue   = i_queue;
                m_control = i_queue->start_consume_impl();
                return m_control != nullptr;
            }